

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

bool __thiscall
AbstractModuleClient::sendGlobalStimulationCommand
          (AbstractModuleClient *this,GlobalStimulationCommand *command)

{
  bool bVar1;
  TrodesMsg m;
  string local_80;
  binarydata local_60;
  TrodesMsg local_40;
  
  TrodesMsg::TrodesMsg(&local_40);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"sn","");
  GlobalStimulationCommand::encode(&local_60,command);
  TrodesMsg::addcontents<char_const*,binarydata>(&local_40,&local_80,"SETGC",&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.str._M_dataplus._M_p != &local_60.str.field_2) {
    operator_delete(local_60.str._M_dataplus._M_p,local_60.str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_40);
  TrodesMsg::~TrodesMsg(&local_40);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendGlobalStimulationCommand(GlobalStimulationCommand command){
    TrodesMsg m;
    m.addcontents("sn", "SETGC", command.encode());
    return sendHardwareMessage(m);
}